

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O1

void CVmObjBigNum::increment_abs(char *ext)

{
  short *psVar1;
  byte bVar2;
  bool bVar3;
  ushort uVar4;
  ulong uVar5;
  short sVar6;
  uint uVar7;
  byte bVar8;
  uint uVar9;
  
  uVar4 = 0;
  if (0 < (short)*(ushort *)(ext + 2)) {
    uVar4 = *(ushort *)(ext + 2);
  }
  if (uVar4 <= *(ushort *)ext) {
    uVar5 = (ulong)uVar4;
    sVar6 = uVar4 * 4;
    bVar3 = true;
    do {
      sVar6 = sVar6 + -4;
      uVar5 = uVar5 - 1;
      if (uVar5 == 0xffffffffffffffff) break;
      bVar8 = ext[(uVar5 >> 1) + 5];
      uVar9 = (uint)(int)(char)bVar8 >> (~(byte)sVar6 & 4);
      uVar7 = uVar9 & 0xf;
      if (uVar7 == 9) {
        bVar8 = '\x0f' << ((byte)sVar6 & 4) & bVar8;
      }
      else {
        bVar2 = (byte)uVar5 & 1;
        bVar8 = (byte)((uVar9 + 1 & 0xf) << (bVar2 * '\x04' ^ 4)) | '\x0f' << (bVar2 << 2) & bVar8;
        bVar3 = false;
      }
      ext[(uVar5 >> 1) + 5] = bVar8;
    } while (uVar7 == 9);
    if (bVar3) {
      sVar6 = *(short *)(ext + 2);
      while (sVar6 < 0) {
        shift_right(ext,1);
        psVar1 = (short *)(ext + 2);
        *psVar1 = *psVar1 + 1;
        sVar6 = *psVar1;
      }
      shift_right(ext,1);
      *(short *)(ext + 2) = *(short *)(ext + 2) + 1;
      ext[5] = ext[5] & 0xfU | 0x10;
    }
    ext[4] = ext[4] & 0xf7;
  }
  return;
}

Assistant:

void CVmObjBigNum::increment_abs(char *ext)
{
    size_t idx;
    int exp = get_exp(ext);
    int carry;

    /* start at the one's place, if represented */
    idx = (exp <= 0 ? 0 : (size_t)exp);

    /* 
     *   if the units digit is to the right of the number (i.e., the number's
     *   scale is large), there's nothing to do 
     */
    if (idx > get_prec(ext))
        return;

    /* increment digits */
    for (carry = TRUE ; idx != 0 ; )
    {
        int dig;

        /* move to the next digit */
        --idx;

        /* get the digit value */
        dig = get_dig(ext, idx);

        /* increment it, checking for carry */
        if (dig == 9)
        {
            /* increment it to zero and keep going to carry */
            set_dig(ext, idx, 0);
        }
        else
        {
            /* increment this digit */
            set_dig(ext, idx, dig + 1);

            /* there's no carry out */
            carry = FALSE;

            /* done */
            break;
        }
    }

    /* if we carried past the end of the number, insert the leading 1 */
    if (carry)
    {
        /* 
         *   if we still haven't reached the units position, shift right
         *   until we do 
         */
        while (get_exp(ext) < 0)
        {
            /* shift it right and adjust the exponent */
            shift_right(ext, 1);
            set_exp(ext, get_exp(ext) + 1);
        }

        /* shift the number right and adjust the exponent */
        shift_right(ext, 1);
        set_exp(ext, get_exp(ext) + 1);

        /* insert the leading 1 */
        set_dig(ext, 0, 1);
    }

    /* we know the value is now non-zero */
    ext[VMBN_FLAGS] &= ~VMBN_F_ZERO;
}